

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d80.cpp
# Opt level: O2

bool ReadD80(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  char extraout_AL;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  Data *data;
  sbyte sVar4;
  size_t in_RCX;
  uint uVar5;
  char *__stream;
  Format fmt;
  uint8_t ab [256];
  
  MemFile::rewind(file,(FILE *)disk);
  if (extraout_AL != '\0') {
    sVar3 = MemFile::read(file,(int)ab,(void *)0x100,in_RCX);
    if ((char)sVar3 == '\0') {
      return false;
    }
    if (ab._204_4_ != 0x534f4453) {
      return false;
    }
    iVar1 = bcmp(ab + 0xb1,ab + 0xb5,3);
    if (iVar1 == 0) {
      __stream = (char *)0x5;
      Format::Format(&fmt,D80);
      fmt.cyls = (int)ab[0xb2];
      fmt.sectors = (int)ab[0xb3];
      fmt.heads = ((ab[0xb1] & 0x10) != 0) + 1;
      Format::Validate(&fmt);
      if (opt.fix != 0) {
        iVar1 = MemFile::size(file);
        iVar2 = Format::disk_size(&fmt);
        if (iVar1 != iVar2) {
          iVar1 = MemFile::size(file);
          iVar2 = Format::track_size(&fmt);
          sVar4 = (sbyte)((ab[0xb1] & 0x10) >> 4);
          uVar5 = iVar2 << sVar4;
          __stream = (char *)(ulong)uVar5;
          if (iVar1 % (int)uVar5 == 0) {
            iVar1 = MemFile::size(file);
            iVar2 = Format::track_size(&fmt);
            fmt.cyls = iVar1 / (iVar2 << sVar4) & 0xff;
            __stream = "corrected cylinder count to match disk size";
            Message<>(msgWarning,"corrected cylinder count to match disk size");
          }
        }
      }
      MemFile::rewind(file,(FILE *)__stream);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(this,&fmt,data,false);
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadD80(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    // Check the signature and the duplicate geometry block
    if (memcmp(ab + 204, D80_SIGNATURE, sizeof(D80_SIGNATURE) - 1) || memcmp(ab + 177, ab + 181, 3))
        return false;

    uint8_t heads = (ab[177] & 0x10) ? 2 : 1;
    uint8_t cyls = ab[178];
    uint8_t sectors = ab[179];

    Format fmt{ RegularFormat::D80 };
    fmt.cyls = cyls;
    fmt.heads = heads;
    fmt.sectors = sectors;
    fmt.Validate();

    // Allow cylinder count correction if the image size is a multiple of the track size
    if (opt.fix != 0 && file.size() != fmt.disk_size() && !(file.size() % (heads * fmt.track_size())))
    {
        fmt.cyls = static_cast<uint8_t>(file.size() / (heads * fmt.track_size()));
        Message(msgWarning, "corrected cylinder count to match disk size");
    }

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "D80";

    return true;
}